

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_tracer.cc
# Opt level: O2

bool rtc::tracing::StartInternalCapture(char *filename)

{
  FILE *file;
  ostream *poVar1;
  LogMessage local_1d8;
  
  file = fopen(filename,"w");
  if (file == (FILE *)0x0) {
    if (LogMessage::min_sev_ < 5) {
      LogMessage::LogMessage
                (&local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/event_tracer.cc"
                 ,0xfa,LERROR,ERRCTX_NONE,0,(char *)0x0);
      poVar1 = std::operator<<((ostream *)&local_1d8,"Failed to open trace file \'");
      poVar1 = std::operator<<(poVar1,filename);
      std::operator<<(poVar1,"\' for writing.");
      LogMessage::~LogMessage(&local_1d8);
    }
  }
  else {
    anon_unknown_0::EventLogger::Start((anonymous_namespace)::g_event_logger,(FILE *)file,true);
  }
  return file != (FILE *)0x0;
}

Assistant:

bool StartInternalCapture(const char* filename) {
  FILE* file = fopen(filename, "w");
  if (!file) {
    LOG(LS_ERROR) << "Failed to open trace file '" << filename
                  << "' for writing.";
    return false;
  }
  g_event_logger->Start(file, true);
  return true;
}